

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

ArgString * __thiscall Potassco::ArgString::get<Clasp::MovingAvg::Type>(ArgString *this,Type *x)

{
  char *pcVar1;
  int iVar2;
  undefined4 in_ECX;
  char *next;
  char *local_10;
  
  pcVar1 = this->in;
  if (pcVar1 != (char *)0x0) {
    local_10 = pcVar1 + (*pcVar1 == this->skip);
    iVar2 = Clasp::xconvert(local_10,x,&local_10,CONCAT31((int3)((uint)in_ECX >> 8),*pcVar1));
    if (iVar2 == 0) {
      local_10 = (char *)0x0;
    }
    this->in = local_10;
    this->skip = ',';
  }
  return this;
}

Assistant:

ArgString& get(T& x)  {
		if (ok()) {
			const char* next = in + (*in == skip);
			in = xconvert(next, x, &next, 0) != 0 ? next : 0;
			skip = ',';
		}
		return *this;
	}